

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseDatalist(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Node *pNVar4;
  Bool BVar5;
  Node *node;
  Node **ppNVar6;
  TidyParserMemory memory;
  
  pLVar2 = doc->lexer;
  if (field == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    if ((long)iVar1 < 0) {
      field = (Node *)0x0;
    }
    else {
      field = (doc->stack).content[iVar1].original_node;
      (doc->stack).top = iVar1 + -1;
    }
  }
  pLVar2->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  do {
    if (node == (Node *)0x0) {
      prvTidyReport(doc,field,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((node->tag == field->tag) && (node->type == EndTag)) {
      prvTidyFreeNode(doc,node);
      field->closed = yes;
      TrimSpaces(doc,field);
      return (Node *)0x0;
    }
    BVar5 = InsertMisc(field,node);
    if (BVar5 == no) {
      if (((node->type == StartTag) && (pDVar3 = node->tag, pDVar3 != (Dict *)0x0)) &&
         ((pDVar3->id == TidyTag_OPTION ||
          ((pDVar3 != (Dict *)0x0 &&
           ((pDVar3->id == TidyTag_OPTGROUP ||
            ((pDVar3 != (Dict *)0x0 &&
             ((pDVar3->id == TidyTag_DATALIST ||
              ((pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_SCRIPT)))))))))))))) {
        node->parent = field;
        if (field == (Node *)0x0) {
          node->prev = (Node *)0x0;
LAB_0013ab73:
          if (field == (Node *)0x0) goto LAB_0013ab88;
          ppNVar6 = &field->content;
        }
        else {
          pNVar4 = field->last;
          node->prev = pNVar4;
          if (pNVar4 == (Node *)0x0) goto LAB_0013ab73;
          ppNVar6 = &pNVar4->next;
        }
        *ppNVar6 = node;
        if (field != (Node *)0x0) {
          field->last = node;
        }
LAB_0013ab88:
        prvTidypushMemory(doc,(TidyParserMemory)
                              ZEXT2448(CONCAT816(node,CONCAT88(field,prvTidyParseDatalist))));
        return node;
      }
      prvTidyReport(doc,field,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    node = prvTidyGetToken(doc,IgnoreWhitespace);
  } while( true );
}

Assistant:

Node* TY_(ParseDatalist)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node))
           )
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseDatalist);
            memory.original_node = field;
            memory.reentry_node = node;
            memory.reentry_mode = IgnoreWhitespace;

            TY_(InsertNodeAtEnd)(field, node);
            TY_(pushMemory)(doc, memory);
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);

    DEBUG_LOG_EXIT;
    return NULL;
}